

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileApprover.cpp
# Opt level: O1

int ApprovalTests::FileApprover::verify
              (EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  int iVar1;
  int extraout_EAX;
  size_t local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  ComparatorFactory::getComparatorForFile((ComparatorFactory *)&local_28,(string *)ctx);
  iVar1 = verify(ctx,sig,local_28,tbs,tbslen);
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
    iVar1 = extraout_EAX;
  }
  return iVar1;
}

Assistant:

void FileApprover::verify(const std::string& receivedPath,
                              const std::string& approvedPath)
    {
        verify(receivedPath,
               approvedPath,
               *ComparatorFactory::getComparatorForFile(receivedPath));
    }